

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_sem.c
# Opt level: O2

QcSem * qc_sem_open(char *name,QcErr *err)

{
  size_t sVar1;
  sem_t *psVar2;
  QcSem *pQVar3;
  char *pcVar4;
  
  sVar1 = strlen(name);
  if (sVar1 < 0x81) {
    psVar2 = sem_open(name,0);
    if (psVar2 != (sem_t *)0x0) {
      pcVar4 = (char *)calloc(1,0x98);
      if (pcVar4 != (char *)0x0) {
        *(sem_t **)(pcVar4 + 0x88) = psVar2;
        pQVar3 = (QcSem *)strncpy(pcVar4,name,0x80);
        return pQVar3;
      }
      fprintf(_stderr,"malloc failed. [%s  line:%d]\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_sem.c"
              ,0x6f);
      __assert_fail("qcSem",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_sem.c"
                    ,0x6f,"QcSem *qc_sem_open(const char *, QcErr *)");
    }
    pcVar4 = "open sem (name : %s) failed.";
  }
  else {
    pcVar4 = "parameter name (%s) is too long.";
  }
  qc_seterr(err,-1,pcVar4,name);
  return (QcSem *)0x0;
}

Assistant:

QcSem* qc_sem_open(const char *name, QcErr *err)
{
    int flags;
    sem_t *sem;

    flags = 0;  //just open

	if (strlen(name) > QC_SEMNAME_MAXLEN)
	{
		qc_seterr(err, -1, "parameter name (%s) is too long.", name);
		return NULL;
	}

    sem = sem_open(name, flags);
    if(NULL == sem)
    {
        qc_seterr(err, -1, "open sem (name : %s) failed.", name);
        return NULL;
    }

    QcSem *qcSem;

    qc_malloc(qcSem, sizeof(QcSem));
    qcSem->sem = sem;
    strncpy(qcSem->name, name, QC_SEMNAME_MAXLEN);
    qcSem->flags = flags;

    return qcSem;
}